

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rosout_appender.cpp
# Opt level: O2

double __thiscall miniros::ROSOutAppender::log(ROSOutAppender *this,double __x)

{
  undefined8 this_00;
  TimeBase<miniros::Time,_miniros::Duration> TVar1;
  uint in_ESI;
  _line_type in_R9D;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  LogPtr msg;
  MasterLinkPtr master;
  allocator<char> local_79;
  value_type local_78;
  undefined1 local_68 [24];
  string local_50;
  
  std::make_shared<rosgraph_msgs::Log_<std::allocator<void>>>();
  TVar1 = (TimeBase<miniros::Time,_miniros::Duration>)Time::now();
  ((local_78.
    super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->header).stamp.super_TimeBase<miniros::Time,_miniros::Duration> = TVar1;
  if (in_ESI < 5) {
    (local_78.
     super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->level = (_level_type)(0x1008040201 >> ((char)in_ESI * '\b' & 0x3fU));
  }
  this_node::getName_abi_cxx11_();
  std::__cxx11::string::_M_assign
            ((string *)
             &(local_78.
               super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->name);
  std::__cxx11::string::assign
            ((char *)&(local_78.
                       super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->msg);
  std::__cxx11::string::assign
            ((char *)&(local_78.
                       super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->file);
  std::__cxx11::string::assign
            ((char *)&(local_78.
                       super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->function);
  (local_78.
   super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  )->line = in_R9D;
  if ((this->topic_manager_).super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_68._0_8_ = (MasterLink *)0x0;
    local_68._8_8_ = 0;
  }
  else {
    TopicManager::getMasterLink((TopicManager *)local_68);
    this_00 = local_68._0_8_;
    if ((MasterLink *)local_68._0_8_ != (MasterLink *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"/rosout_disable_topics_generation",&local_79);
      MasterLink::getCached((MasterLink *)this_00,&local_50,&this->disable_topics_);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if (this->disable_topics_ == false) {
    this_node::getAdvertisedTopics
              (&(local_78.
                 super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->topics);
  }
  if (in_ESI - 3 < 2) {
    std::__cxx11::string::assign((char *)&this->last_error_);
  }
  std::mutex::lock(&this->queue_mutex_);
  std::
  vector<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>,_std::allocator<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_>_>
  ::push_back(&this->log_queue_,&local_78);
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.
              super___shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

void ROSOutAppender::log(::miniros::console::Level level, const char* str, const char* file, const char* function, int line)
{
  rosgraph_msgs::LogPtr msg(std::make_shared<rosgraph_msgs::Log>());

  msg->header.stamp = miniros::Time::now();
  if (level == miniros::console::Level::Debug)
  {
    msg->level = rosgraph_msgs::Log::DEBUG;
  }
  else if (level == miniros::console::Level::Info)
  {
    msg->level = rosgraph_msgs::Log::INFO;
  }
  else if (level == miniros::console::Level::Warn)
  {
    msg->level = rosgraph_msgs::Log::WARN;
  }
  else if (level == miniros::console::Level::Error)
  {
    msg->level = rosgraph_msgs::Log::ERROR;
  }
  else if (level == miniros::console::Level::Fatal)
  {
    msg->level = rosgraph_msgs::Log::FATAL;
  }
  msg->name = this_node::getName();
  msg->msg = str;
  msg->file = file;
  msg->function = function;
  msg->line = line;

  MasterLinkPtr master = topic_manager_ ? topic_manager_->getMasterLink() : MasterLinkPtr();
  // check parameter server/cache for omit_topics flag
  // the same parameter is checked in rosout.py for the same purpose
  if (master)
    master->getCached("/rosout_disable_topics_generation", disable_topics_);

  if (!disable_topics_) {
    this_node::getAdvertisedTopics(msg->topics);
  }

  if (level == ::miniros::console::Level::Fatal || level == ::miniros::console::Level::Error)
  {
    last_error_ = str;
  }

  std::scoped_lock<std::mutex> lock(queue_mutex_);
  log_queue_.push_back(msg);
  queue_condition_.notify_all();
}